

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::Vector::RecursiveToUnifiedFormat
               (Vector *input,idx_t count,RecursiveUnifiedVectorFormat *data)

{
  PhysicalType PVar1;
  Vector *pVVar2;
  idx_t iVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  pointer puVar4;
  reference this_00;
  type input_00;
  reference data_00;
  pointer puVar5;
  idx_t i;
  ulong uVar6;
  
  do {
    ToUnifiedFormat(input,count,&data->unified);
    LogicalType::operator=(&data->logical_type,&input->type);
    PVar1 = (input->type).physical_type_;
    if (PVar1 == LIST) {
      pVVar2 = ListVector::GetEntryInternal<duckdb::Vector>(input);
      count = ListVector::GetListSize(input);
    }
    else {
      if (PVar1 != ARRAY) {
        if (PVar1 == STRUCT) {
          this = StructVector::GetEntries(input);
          uVar6 = 0;
          while( true ) {
            puVar5 = (this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((ulong)((long)puVar4 - (long)puVar5 >> 3) <= uVar6) break;
            ::std::
            vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
            ::emplace_back<>(&(data->children).
                              super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
                            );
            uVar6 = uVar6 + 1;
          }
          for (uVar6 = 0; uVar6 < (ulong)((long)puVar4 - (long)puVar5 >> 3); uVar6 = uVar6 + 1) {
            this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this,uVar6);
            input_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                       operator*(this_00);
            data_00 = vector<duckdb::RecursiveUnifiedVectorFormat,_true>::get<true>
                                (&data->children,uVar6);
            RecursiveToUnifiedFormat(input_00,count,data_00);
            puVar5 = (this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        return;
      }
      pVVar2 = ArrayVector::GetEntryInternal<duckdb::Vector>(input);
      iVar3 = ArrayType::GetSize(&input->type);
      count = count * iVar3;
    }
    ::std::
    vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
    ::emplace_back<>(&(data->children).
                      super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
                    );
    data = vector<duckdb::RecursiveUnifiedVectorFormat,_true>::back(&data->children);
    input = pVVar2;
  } while( true );
}

Assistant:

void Vector::RecursiveToUnifiedFormat(Vector &input, idx_t count, RecursiveUnifiedVectorFormat &data) {

	input.ToUnifiedFormat(count, data.unified);
	data.logical_type = input.GetType();

	if (input.GetType().InternalType() == PhysicalType::LIST) {
		auto &child = ListVector::GetEntry(input);
		auto child_count = ListVector::GetListSize(input);
		data.children.emplace_back();
		Vector::RecursiveToUnifiedFormat(child, child_count, data.children.back());

	} else if (input.GetType().InternalType() == PhysicalType::ARRAY) {
		auto &child = ArrayVector::GetEntry(input);
		auto array_size = ArrayType::GetSize(input.GetType());
		auto child_count = count * array_size;
		data.children.emplace_back();
		Vector::RecursiveToUnifiedFormat(child, child_count, data.children.back());

	} else if (input.GetType().InternalType() == PhysicalType::STRUCT) {
		auto &children = StructVector::GetEntries(input);
		for (idx_t i = 0; i < children.size(); i++) {
			data.children.emplace_back();
		}
		for (idx_t i = 0; i < children.size(); i++) {
			Vector::RecursiveToUnifiedFormat(*children[i], count, data.children[i]);
		}
	}
}